

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ModportSimplePortListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ModportSimplePortListSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>const&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,SeparatedSyntaxList<slang::syntax::ModportPortSyntax> *args_2)

{
  Token direction;
  ModportSimplePortListSyntax *this_00;
  
  this_00 = (ModportSimplePortListSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ModportSimplePortListSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (ModportSimplePortListSyntax *)allocateSlow(this,0x80,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  direction.kind = args_1->kind;
  direction._2_1_ = args_1->field_0x2;
  direction.numFlags.raw = (args_1->numFlags).raw;
  direction.rawLen = args_1->rawLen;
  direction.info = args_1->info;
  slang::syntax::ModportSimplePortListSyntax::ModportSimplePortListSyntax
            (this_00,args,direction,args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }